

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UCharCharacterIterator::move32(UCharCharacterIterator *this,int32_t delta,EOrigin origin)

{
  int iVar1;
  char16_t cVar2;
  char16_t *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  
  if (origin == kEnd) {
    iVar7 = (this->super_CharacterIterator).end;
    (this->super_CharacterIterator).pos = iVar7;
    if (delta < 0) {
      iVar4 = (this->super_CharacterIterator).begin;
      pcVar3 = this->text;
      iVar5 = 1 - delta;
      do {
        if (iVar7 <= iVar4) break;
        iVar6 = iVar7 + -1;
        (this->super_CharacterIterator).pos = iVar6;
        if (((iVar4 < iVar6) && ((pcVar3[(long)iVar7 + -1] & 0xfc00U) == 0xdc00)) &&
           ((pcVar3[(long)iVar7 + -2] & 0xfc00U) == 0xd800)) {
          (this->super_CharacterIterator).pos = iVar7 + -2;
          iVar6 = iVar7 + -2;
        }
        iVar7 = iVar6;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
  }
  else if (origin == kCurrent) {
    if (delta < 1) {
      if (delta < 0) {
        iVar7 = (this->super_CharacterIterator).pos;
        iVar4 = (this->super_CharacterIterator).begin;
        pcVar3 = this->text;
        iVar5 = 1 - delta;
        do {
          if (iVar7 <= iVar4) break;
          iVar6 = iVar7 + -1;
          (this->super_CharacterIterator).pos = iVar6;
          if (((iVar4 < iVar6) && ((pcVar3[(long)iVar7 + -1] & 0xfc00U) == 0xdc00)) &&
             ((pcVar3[(long)iVar7 + -2] & 0xfc00U) == 0xd800)) {
            (this->super_CharacterIterator).pos = iVar7 + -2;
            iVar6 = iVar7 + -2;
          }
          iVar7 = iVar6;
          iVar5 = iVar5 + -1;
        } while (1 < iVar5);
      }
    }
    else {
      iVar4 = (this->super_CharacterIterator).pos;
      iVar5 = (this->super_CharacterIterator).end;
      pcVar3 = this->text;
      iVar6 = delta + 1;
      do {
        if (iVar4 < iVar5) {
          cVar2 = pcVar3[iVar4];
        }
        else if ((-1 < iVar5) || (cVar2 = pcVar3[iVar4], cVar2 == L'\0')) break;
        iVar1 = iVar4 + 1;
        (this->super_CharacterIterator).pos = iVar1;
        if ((((cVar2 & 0xfc00U) == 0xd800) && (iVar1 != iVar5)) &&
           ((pcVar3[iVar1] & 0xfc00U) == 0xdc00)) {
          (this->super_CharacterIterator).pos = iVar4 + 2;
          iVar1 = iVar4 + 2;
        }
        iVar4 = iVar1;
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
    }
  }
  else if (origin == kStart) {
    iVar4 = (this->super_CharacterIterator).begin;
    (this->super_CharacterIterator).pos = iVar4;
    if (0 < delta) {
      iVar5 = (this->super_CharacterIterator).end;
      pcVar3 = this->text;
      iVar6 = delta + 1;
      do {
        if (iVar4 < iVar5) {
          cVar2 = pcVar3[iVar4];
        }
        else if ((-1 < iVar5) || (cVar2 = pcVar3[iVar4], cVar2 == L'\0')) break;
        iVar1 = iVar4 + 1;
        (this->super_CharacterIterator).pos = iVar1;
        if ((((cVar2 & 0xfc00U) == 0xd800) && (iVar1 != iVar5)) &&
           ((pcVar3[iVar1] & 0xfc00U) == 0xdc00)) {
          (this->super_CharacterIterator).pos = iVar4 + 2;
          iVar1 = iVar4 + 2;
        }
        iVar4 = iVar1;
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
    }
  }
  return (this->super_CharacterIterator).pos;
}

Assistant:

int32_t
UCharCharacterIterator::move32(int32_t delta, CharacterIterator::EOrigin origin) {
    // this implementation relies on the "safe" version of the UTF macros
    // (or the trustworthiness of the caller)
    switch(origin) {
    case kStart:
        pos = begin;
        if(delta > 0) {
            U16_FWD_N(text, pos, end, delta);
        }
        break;
    case kCurrent:
        if(delta > 0) {
            U16_FWD_N(text, pos, end, delta);
        } else {
            U16_BACK_N(text, begin, pos, -delta);
        }
        break;
    case kEnd:
        pos = end;
        if(delta < 0) {
            U16_BACK_N(text, begin, pos, -delta);
        }
        break;
    default:
        break;
    }

    return pos;
}